

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resource.h
# Opt level: O2

StringView Corrade::Utility::Implementation::resourceDataAt(uint *positions,uchar *data,size_t i)

{
  ulong uVar1;
  StringView local_18;
  
  if (i == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)positions[i * 2 + -1];
  }
  Containers::BasicStringView<const_char>::BasicStringView
            (&local_18,(char *)(data + uVar1),
             (ulong)positions[i * 2 + 1] - ((positions[i * 2] >> 0x18) + uVar1),
             (StringViewFlags)(((ulong)(0xffffff < positions[i * 2]) | 0xfffffffffffffffe) << 0x3e))
  ;
  return local_18;
}

Assistant:

inline Containers::StringView resourceDataAt(const unsigned int* const positions, const unsigned char* const data, const std::size_t i) {
    /* Every position pair denotes end offsets of one file, data is second */
    const std::size_t begin = i == 0 ? 0 : positions[2*(i - 1) + 1];
    const std::size_t end = positions[2*i + 1];
    /* If there's any padding after (contained in the upper 8 bits of
       filename), the data can be marked as null-terminated. This can be either
       deliberate (a single null byte added after) or "accidental" due to for
       example padding for alignment. */
    const std::size_t padding = (positions[2*i + 0] >> 24 & 0xff);
    return {reinterpret_cast<const char*>(data) + begin, end - begin - padding, Containers::StringViewFlag::Global|(padding ? Containers::StringViewFlag::NullTerminated : Containers::StringViewFlag{})};
}